

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg4
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  uint uVar1;
  uint uVar2;
  Opnd *newSrc;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  Instr *pIVar11;
  RegOpnd *src1Opnd;
  ByteCodeUsesInstr *this_00;
  IntConstOpnd *pIVar12;
  IndirOpnd *pIVar13;
  StackSym *pSVar14;
  RegOpnd *dstOpnd;
  int iVar15;
  undefined6 in_register_00000032;
  
  iVar15 = (int)CONCAT62(in_register_00000032,newOpcode);
  if ((iVar15 != 0xfc) && (iVar15 != 0x184)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x982,
                       "(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify)",
                       "newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pRVar6 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar7 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  pRVar8 = BuildSrcOpnd(this,src3RegSlot,TyVar);
  if (newOpcode == Restify) {
    pRVar9 = BuildSrcOpnd(this,dstRegSlot,TyVar);
    pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ExtendArg_A,&pRVar10->super_Opnd,&pRVar8->super_Opnd,this->m_func);
    AddInstr(this,pIVar11,offset);
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pRVar7->super_Opnd,pIVar11->m_dst,
                             this->m_func);
    AddInstr(this,pIVar11,0xffffffff);
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ExtendArg_A,&pRVar7->super_Opnd,&pRVar6->super_Opnd,pIVar11->m_dst,
                             this->m_func);
    AddInstr(this,pIVar11,0xffffffff);
    pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ExtendArg_A,&pRVar6->super_Opnd,&pRVar9->super_Opnd,pIVar11->m_dst,
                             this->m_func);
    AddInstr(this,pIVar11,0xffffffff);
    newSrc = pIVar11->m_dst;
    pIVar11 = IR::Instr::New(Restify,this->m_func);
    IR::Instr::SetSrc1(pIVar11,newSrc);
  }
  else {
    pRVar9 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    pRVar10 = InsertConvPrimStr(this,pRVar6,offset,true);
    src1Opnd = InsertConvPrimStr(this,pRVar7,0xffffffff,true);
    pRVar8 = InsertConvPrimStr(this,pRVar8,0xffffffff,true);
    uVar1 = *(uint *)&pRVar6->m_sym->field_0x18;
    uVar2 = *(uint *)&pRVar7->m_sym->field_0x18;
    if (((uVar2 | uVar1) >> 0xd & 1) != 0) {
      this_00 = IR::ByteCodeUsesInstr::New(this->m_func,0xffffffff);
      if ((uVar1 >> 0xd & 1) != 0) {
        IR::ByteCodeUsesInstr::Set(this_00,&pRVar6->super_Opnd);
      }
      if ((uVar2 >> 0xd & 1) != 0) {
        IR::ByteCodeUsesInstr::Set(this_00,&pRVar7->super_Opnd);
      }
      AddInstr(this,&this_00->super_Instr,0xffffffff);
    }
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,BackendConcatExprOptPhase,sourceContextId,functionId)
    ;
    if (bVar4) {
      pIVar12 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar11 = IR::Instr::New(NewConcatStrMulti,&pRVar9->super_Opnd,&pIVar12->super_Opnd,
                               this->m_func);
      IR::Opnd::SetValueType(&pRVar9->super_Opnd,(ValueType)0x800);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar13 = IR::IndirOpnd::New(pRVar9,0,TyVar,this->m_func,false);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItem,&pIVar13->super_Opnd,&pRVar10->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar13 = IR::IndirOpnd::New(pRVar9,1,TyVar,this->m_func,false);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItem,&pIVar13->super_Opnd,&src1Opnd->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar13 = IR::IndirOpnd::New(pRVar9,2,TyVar,this->m_func,false);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItem,&pIVar13->super_Opnd,&pRVar8->super_Opnd,
                               this->m_func);
    }
    else {
      pSVar14 = StackSym::New(this->m_func);
      pRVar6 = IR::RegOpnd::New(pSVar14,TyVar,this->m_func);
      pSVar14 = StackSym::New(this->m_func);
      pRVar7 = IR::RegOpnd::New(pSVar14,TyVar,this->m_func);
      pSVar14 = StackSym::New(this->m_func);
      dstOpnd = IR::RegOpnd::New(pSVar14,TyVar,this->m_func);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar6->super_Opnd,&pRVar10->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,
                               &pRVar6->super_Opnd,this->m_func);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar11 = IR::Instr::New(SetConcatStrMultiItemBE,&dstOpnd->super_Opnd,&pRVar8->super_Opnd,
                               &pRVar7->super_Opnd,this->m_func);
      AddInstr(this,pIVar11,0xffffffff);
      pIVar12 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar11 = IR::Instr::New(NewConcatStrMultiBE,&pRVar9->super_Opnd,&pIVar12->super_Opnd,
                               &dstOpnd->super_Opnd,this->m_func);
      IR::Opnd::SetValueType(&pRVar9->super_Opnd,(ValueType)0x800);
    }
  }
  AddInstr(this,pIVar11,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildReg4(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                    Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot)
{
    IR::Instr *     instr = nullptr;
    Assert(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify);

    IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd * src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd * src3Opnd = this->BuildSrcOpnd(src3RegSlot);    

    if (newOpcode == Js::OpCode::Restify)
    {
        IR::RegOpnd * src0Opnd = this->BuildSrcOpnd(dstRegSlot);
        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::Opnd *firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        return;
    }

    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(dstRegSlot);

    IR::RegOpnd * str1Opnd = InsertConvPrimStr(src1Opnd, offset, true);
    IR::RegOpnd * str2Opnd = InsertConvPrimStr(src2Opnd, Js::Constants::NoByteCodeOffset, true);
    IR::RegOpnd * str3Opnd = InsertConvPrimStr(src3Opnd, Js::Constants::NoByteCodeOffset, true);

    // Need to insert a byte code use for src1/src2 that if ConvPrimStr of the src2/src3 bail out
    // we will restore it.
    bool src1HasByteCodeRegSlot = src1Opnd->m_sym->HasByteCodeRegSlot();
    bool src2HasByteCodeRegSlot = src2Opnd->m_sym->HasByteCodeRegSlot();
    if (src1HasByteCodeRegSlot || src2HasByteCodeRegSlot)
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, Js::Constants::NoByteCodeOffset);
        if (src1HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src1Opnd);
        }
        if (src2HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src2Opnd);
        }
        this->AddInstr(byteCodeUse, Js::Constants::NoByteCodeOffset);
    }

    if (!PHASE_OFF(Js::BackendConcatExprOptPhase, this->m_func))
    {
        IR::RegOpnd* tmpDstOpnd1 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd2 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd3 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd1, str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd2, str2Opnd, tmpDstOpnd1, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd3, str3Opnd, tmpDstOpnd2, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::IntConstOpnd * countIntConstOpnd = IR::IntConstOpnd::New(3, TyUint32, m_func, true);
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMultiBE, dstOpnd, countIntConstOpnd, tmpDstOpnd3, m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMulti, dstOpnd, IR::IntConstOpnd::New(3, TyUint32, m_func, true), m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 0, TyVar, m_func), str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 1, TyVar, m_func), str2Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 2, TyVar, m_func), str3Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
}